

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O2

Matrix<long_double> * __thiscall
neural_networks::utilities::Matrix<long_double>::transpose(Matrix<long_double> *this)

{
  size_type __n;
  size_t sVar1;
  size_t sVar2;
  pointer pvVar3;
  Matrix<long_double> *this_00;
  size_t sVar4;
  pointer pvVar5;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  allocator_type local_42;
  allocator_type local_41;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  temp_vector;
  _Vector_base<long_double,_std::allocator<long_double>_> local_28;
  
  __n = this->M;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)&local_28,this->N,&local_41);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::vector(&temp_vector,__n,(value_type *)&local_28,&local_42);
  std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base(&local_28);
  sVar1 = this->N;
  sVar2 = this->M;
  for (sVar4 = 0; sVar4 != sVar1; sVar4 = sVar4 + 1) {
    pvVar3 = (this->matrix).
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    pvVar5 = temp_vector.
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar7 = sVar2;
    while (bVar8 = sVar7 != 0, sVar7 = sVar7 - 1, bVar8) {
      (pvVar5->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar4] =
           *(longdouble *)
            (*(long *)&pvVar3[sVar4].super__Vector_base<long_double,_std::allocator<long_double>_>.
                       _M_impl.super__Vector_impl_data + lVar6);
      pvVar5 = pvVar5 + 1;
      lVar6 = lVar6 + 0x10;
    }
  }
  this_00 = (Matrix<long_double> *)operator_new(0x30);
  Matrix(this_00,&temp_vector);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::~vector(&temp_vector);
  return this_00;
}

Assistant:

neural_networks::utilities::Matrix<T>* neural_networks::utilities::Matrix<T>::transpose() const {
    std::vector< std::vector<T> > temp_vector(M, std::vector<T>(N));
    register size_t i, j;
    for(i = 0; i < N; ++i) {
        for(j = 0; j < M; ++j) {
            temp_vector[j][i] = matrix[i][j];
        }
    }
    neural_networks::utilities::Matrix<T> *to_return = new neural_networks::utilities::Matrix<T>(temp_vector);
    return to_return;
}